

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

_Bool liveness_pass_2(TCGContext_conflict9 *s)

{
  int iVar1;
  int iVar2;
  TCGOp *pTVar3;
  TCGOpDef *pTVar4;
  ushort uVar5;
  uint uVar6;
  TCGOpcode TVar7;
  TCGTemp *pTVar8;
  TCGTemp *pTVar9;
  TCGOp *pTVar10;
  TCGArg TVar11;
  TCGOp *sop;
  TCGOpcode sopc;
  TCGOp *lop;
  TCGOpcode lopc;
  TCGTemp *dir_ts;
  TCGTemp *arg_ts;
  int call_flags;
  int nb_oargs;
  int nb_iargs;
  TCGLifeData arg_life;
  TCGOpDef *def;
  TCGOpcode opc;
  TCGTemp *its_1;
  TCGTemp *dts;
  TCGTemp *its;
  TCGOp *op_next;
  TCGOp *op;
  _Bool changes;
  int i;
  int nb_temps;
  int nb_globals;
  TCGContext_conflict9 *s_local;
  
  iVar1 = s->nb_globals;
  op._3_1_ = false;
  for (op._4_4_ = 0; (int)op._4_4_ < iVar1; op._4_4_ = op._4_4_ + 1) {
    pTVar9 = s->temps + (int)op._4_4_;
    if ((*(ulong *)pTVar9 >> 0x21 & 1) == 0) {
      pTVar9->state_ptr = (void *)0x0;
    }
    else {
      pTVar8 = tcg_temp_alloc(s);
      *(ulong *)pTVar8 =
           *(ulong *)pTVar8 & 0xffffffff00ffffff |
           (ulong)((uint)(*(ulong *)pTVar9 >> 0x18) & 0xff) << 0x18;
      *(ulong *)pTVar8 =
           *(ulong *)pTVar8 & 0xffffffffff00ffff |
           (ulong)((uint)(*(ulong *)pTVar9 >> 0x10) & 0xff) << 0x10;
      pTVar9->state_ptr = pTVar8;
    }
    pTVar9->state = 1;
  }
  iVar2 = s->nb_temps;
  for (; (int)op._4_4_ < iVar2; op._4_4_ = op._4_4_ + 1) {
    s->temps[(int)op._4_4_].state_ptr = (void *)0x0;
    s->temps[(int)op._4_4_].state = 1;
  }
  pTVar3 = (s->ops).tqh_first;
  while (op_next = pTVar3, op_next != (TCGOp *)0x0) {
    pTVar3 = (op_next->link).tqe_next;
    uVar6 = *(uint *)op_next & 0xff;
    pTVar4 = s->tcg_op_defs;
    uVar5 = (ushort)((uint)*(undefined4 *)op_next >> 0x10);
    if (uVar6 == 2) {
      arg_ts._4_4_ = *(uint *)op_next >> 0xc & 0xf;
      call_flags = *(uint *)op_next >> 8 & 0xf;
      arg_ts._0_4_ = (uint)op_next->args[(int)(arg_ts._4_4_ + call_flags + 1)];
    }
    else {
      call_flags = (int)pTVar4[uVar6].nb_iargs;
      arg_ts._4_4_ = (uint)pTVar4[uVar6].nb_oargs;
      if ((pTVar4[uVar6].flags & 2) == 0) {
        if ((pTVar4[uVar6].flags & 8) == 0) {
          arg_ts._0_4_ = 3;
        }
        else {
          arg_ts._0_4_ = 2;
        }
      }
      else {
        arg_ts._0_4_ = 0;
      }
    }
    for (op._4_4_ = arg_ts._4_4_; (int)op._4_4_ < (int)(call_flags + arg_ts._4_4_);
        op._4_4_ = op._4_4_ + 1) {
      pTVar9 = arg_temp(op_next->args[(int)op._4_4_]);
      if (((pTVar9 != (TCGTemp *)0x0) &&
          (pTVar8 = (TCGTemp *)pTVar9->state_ptr, pTVar8 != (TCGTemp *)0x0)) && (pTVar9->state == 1)
         ) {
        TVar7 = INDEX_op_ld_i64;
        if (((undefined1  [56])*pTVar9 & (undefined1  [56])0xff000000) == (undefined1  [56])0x0) {
          TVar7 = INDEX_op_ld_i32;
        }
        pTVar10 = tcg_op_insert_before_tricore(s,op_next,TVar7);
        TVar11 = temp_arg(pTVar8);
        pTVar10->args[0] = TVar11;
        TVar11 = temp_arg(pTVar9->mem_base);
        pTVar10->args[1] = TVar11;
        pTVar10->args[2] = pTVar9->mem_offset;
        pTVar9->state = 2;
      }
    }
    for (op._4_4_ = arg_ts._4_4_; (int)op._4_4_ < (int)(call_flags + arg_ts._4_4_);
        op._4_4_ = op._4_4_ + 1) {
      pTVar9 = arg_temp(op_next->args[(int)op._4_4_]);
      if ((pTVar9 != (TCGTemp *)0x0) && ((TCGTemp *)pTVar9->state_ptr != (TCGTemp *)0x0)) {
        TVar11 = temp_arg((TCGTemp *)pTVar9->state_ptr);
        op_next->args[(int)op._4_4_] = TVar11;
        op._3_1_ = true;
        if (((uint)uVar5 & 4 << ((byte)op._4_4_ & 0x1f)) != 0) {
          pTVar9->state = 1;
        }
      }
    }
    if (((uint)arg_ts & 1) == 0) {
      if (((uint)arg_ts & 2) == 0) {
        for (op._4_4_ = 0; (int)op._4_4_ < iVar1; op._4_4_ = op._4_4_ + 1) {
        }
      }
      else {
        for (op._4_4_ = 0; (int)op._4_4_ < iVar1; op._4_4_ = op._4_4_ + 1) {
        }
      }
    }
    for (op._4_4_ = 0; (int)op._4_4_ < (int)arg_ts._4_4_; op._4_4_ = op._4_4_ + 1) {
      pTVar8 = arg_temp(op_next->args[(int)op._4_4_]);
      pTVar9 = (TCGTemp *)pTVar8->state_ptr;
      if (pTVar9 != (TCGTemp *)0x0) {
        TVar11 = temp_arg(pTVar9);
        op_next->args[(int)op._4_4_] = TVar11;
        op._3_1_ = true;
        pTVar8->state = 0;
        if (((uint)uVar5 & 1 << ((byte)op._4_4_ & 0x1f)) != 0) {
          TVar7 = INDEX_op_st_i64;
          if (((undefined1  [56])*pTVar8 & (undefined1  [56])0xff000000) == (undefined1  [56])0x0) {
            TVar7 = INDEX_op_st_i32;
          }
          pTVar10 = tcg_op_insert_after_tricore(s,op_next,TVar7);
          TVar11 = temp_arg(pTVar9);
          pTVar10->args[0] = TVar11;
          TVar11 = temp_arg(pTVar8->mem_base);
          pTVar10->args[1] = TVar11;
          pTVar10->args[2] = pTVar8->mem_offset;
          pTVar8->state = 2;
        }
        if (((uint)uVar5 & 4 << ((byte)op._4_4_ & 0x1f)) != 0) {
          pTVar8->state = 1;
        }
      }
    }
  }
  return op._3_1_;
}

Assistant:

static bool liveness_pass_2(TCGContext *s)
{
    int nb_globals = s->nb_globals;
    int nb_temps, i;
    bool changes = false;
    TCGOp *op, *op_next;

    /* Create a temporary for each indirect global.  */
    for (i = 0; i < nb_globals; ++i) {
        TCGTemp *its = &s->temps[i];
        if (its->indirect_reg) {
            TCGTemp *dts = tcg_temp_alloc(s);
            dts->type = its->type;
            dts->base_type = its->base_type;
            its->state_ptr = dts;
        } else {
            its->state_ptr = NULL;
        }
        /* All globals begin dead.  */
        its->state = TS_DEAD;
    }
    for (nb_temps = s->nb_temps; i < nb_temps; ++i) {
        TCGTemp *its = &s->temps[i];
        its->state_ptr = NULL;
        its->state = TS_DEAD;
    }

    QTAILQ_FOREACH_SAFE(op, &s->ops, link, op_next) {
        TCGOpcode opc = op->opc;
        const TCGOpDef *def = &s->tcg_op_defs[opc];
        TCGLifeData arg_life = op->life;
        int nb_iargs, nb_oargs, call_flags;
        TCGTemp *arg_ts, *dir_ts;

        if (opc == INDEX_op_call) {
            nb_oargs = TCGOP_CALLO(op);
            nb_iargs = TCGOP_CALLI(op);
            call_flags = op->args[nb_oargs + nb_iargs + 1];
        } else {
            nb_iargs = def->nb_iargs;
            nb_oargs = def->nb_oargs;

            /* Set flags similar to how calls require.  */
            if (def->flags & TCG_OPF_BB_END) {
                /* Like writing globals: save_globals */
                call_flags = 0;
            } else if (def->flags & TCG_OPF_SIDE_EFFECTS) {
                /* Like reading globals: sync_globals */
                call_flags = TCG_CALL_NO_WRITE_GLOBALS;
            } else {
                /* No effect on globals.  */
                call_flags = (TCG_CALL_NO_READ_GLOBALS |
                              TCG_CALL_NO_WRITE_GLOBALS);
            }
        }

        /* Make sure that input arguments are available.  */
        for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
            arg_ts = arg_temp(op->args[i]);
            if (arg_ts) {
                dir_ts = arg_ts->state_ptr;
                if (dir_ts && arg_ts->state == TS_DEAD) {
                    TCGOpcode lopc = (arg_ts->type == TCG_TYPE_I32
                                      ? INDEX_op_ld_i32
                                      : INDEX_op_ld_i64);
                    TCGOp *lop = tcg_op_insert_before(s, op, lopc);

                    lop->args[0] = temp_arg(dir_ts);
                    lop->args[1] = temp_arg(arg_ts->mem_base);
                    lop->args[2] = arg_ts->mem_offset;

                    /* Loaded, but synced with memory.  */
                    arg_ts->state = TS_MEM;
                }
            }
        }

        /* Perform input replacement, and mark inputs that became dead.
           No action is required except keeping temp_state up to date
           so that we reload when needed.  */
        for (i = nb_oargs; i < nb_iargs + nb_oargs; i++) {
            arg_ts = arg_temp(op->args[i]);
            if (arg_ts) {
                dir_ts = arg_ts->state_ptr;
                if (dir_ts) {
                    op->args[i] = temp_arg(dir_ts);
                    changes = true;
                    if (IS_DEAD_ARG(i)) {
                        arg_ts->state = TS_DEAD;
                    }
                }
            }
        }

        /* Liveness analysis should ensure that the following are
           all correct, for call sites and basic block end points.  */
        if (call_flags & TCG_CALL_NO_READ_GLOBALS) {
            /* Nothing to do */
        } else if (call_flags & TCG_CALL_NO_WRITE_GLOBALS) {
            for (i = 0; i < nb_globals; ++i) {
                /* Liveness should see that globals are synced back,
                   that is, either TS_DEAD or TS_MEM.  */
                arg_ts = &s->temps[i];
                tcg_debug_assert(arg_ts->state_ptr == 0
                                 || arg_ts->state != 0);
            }
        } else {
            for (i = 0; i < nb_globals; ++i) {
                /* Liveness should see that globals are saved back,
                   that is, TS_DEAD, waiting to be reloaded.  */
                arg_ts = &s->temps[i];
                tcg_debug_assert(arg_ts->state_ptr == 0
                                 || arg_ts->state == TS_DEAD);
            }
        }

        /* Outputs become available.  */
        for (i = 0; i < nb_oargs; i++) {
            arg_ts = arg_temp(op->args[i]);
            dir_ts = arg_ts->state_ptr;
            if (!dir_ts) {
                continue;
            }
            op->args[i] = temp_arg(dir_ts);
            changes = true;

            /* The output is now live and modified.  */
            arg_ts->state = 0;

            /* Sync outputs upon their last write.  */
            if (NEED_SYNC_ARG(i)) {
                TCGOpcode sopc = (arg_ts->type == TCG_TYPE_I32
                                  ? INDEX_op_st_i32
                                  : INDEX_op_st_i64);
                TCGOp *sop = tcg_op_insert_after(s, op, sopc);

                sop->args[0] = temp_arg(dir_ts);
                sop->args[1] = temp_arg(arg_ts->mem_base);
                sop->args[2] = arg_ts->mem_offset;

                arg_ts->state = TS_MEM;
            }
            /* Drop outputs that are dead.  */
            if (IS_DEAD_ARG(i)) {
                arg_ts->state = TS_DEAD;
            }
        }
    }

    return changes;
}